

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O2

char * Fverb::parameter_symbol(uint index)

{
  if (index < 0xb) {
    return &DAT_0010aab0 + *(int *)(&DAT_0010aab0 + (ulong)index * 4);
  }
  return (char *)0x0;
}

Assistant:

const char *Fverb::parameter_symbol(unsigned index) noexcept
{
    switch (index) {

    case 0:
        return "predelay";

    case 1:
        return "input";

    case 2:
        return "input_lowpass";

    case 3:
        return "input_highpass";

    case 4:
        return "input_diffusion_1";

    case 5:
        return "input_diffusion_2";

    case 6:
        return "tail_density";

    case 7:
        return "decay";

    case 8:
        return "damping";

    case 9:
        return "mod_frequency";

    case 10:
        return "mod_depth";

    default:
        return 0;
    }
}